

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O1

parser_error parse_object_property_code(parser *p)

{
  int iVar1;
  parser_error pVar2;
  void *pvVar3;
  char *code;
  char **code_name;
  
  pvVar3 = parser_priv(p);
  code = parser_getstr(p,"code");
  if (pvVar3 == (void *)0x0) {
    return PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  switch(*(undefined4 *)((long)pvVar3 + 8)) {
  case 0:
    return PARSE_ERROR_MISSING_OBJ_PROP_TYPE;
  case 1:
  case 2:
    code_name = obj_mods;
    break;
  case 3:
    code_name = obj_flags;
    break;
  case 4:
  case 5:
    code_name = element_names;
    break;
  default:
    iVar1 = -1;
    goto LAB_001a30d1;
  }
  iVar1 = code_index_in_array(code_name,code);
LAB_001a30d1:
  if (iVar1 < 0) {
    pVar2 = PARSE_ERROR_INVALID_OBJ_PROP_CODE;
  }
  else {
    *(int *)((long)pvVar3 + 0x14) = iVar1;
    pVar2 = PARSE_ERROR_NONE;
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_object_property_code(struct parser *p) {
	struct obj_property *prop = parser_priv(p);
	const char *code = parser_getstr(p, "code");
	int index = -1;

	if (!prop) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (!prop->type) {
		return PARSE_ERROR_MISSING_OBJ_PROP_TYPE;
	}
	if (prop->type == OBJ_PROPERTY_STAT) {
		index = code_index_in_array(obj_mods, code);
	} else if (prop->type == OBJ_PROPERTY_MOD) {
		index = code_index_in_array(obj_mods, code);
	} else if (prop->type == OBJ_PROPERTY_FLAG) {
		index = code_index_in_array(obj_flags, code);
	} else if (prop->type == OBJ_PROPERTY_IGNORE) {
		index = code_index_in_array(element_names, code);
	} else if (prop->type == OBJ_PROPERTY_ELEMENT) {
		index = code_index_in_array(element_names, code);
	}
	if (index >= 0) {
		prop->index = index;
	} else {
		return PARSE_ERROR_INVALID_OBJ_PROP_CODE;
	}
	return PARSE_ERROR_NONE;
}